

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

void initialize_test(int *argcp,char ***argvp,IceTCommunicator comm)

{
  char **ppcVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  char *__format;
  char filename [64];
  uint local_a0;
  IceTSizeType local_9c;
  IceTSizeType local_94;
  char local_78 [72];
  
  iVar7 = *argcp;
  ppcVar1 = *argvp;
  uVar3 = (*comm->Comm_rank)(comm);
  iVar4 = (*comm->Comm_size)(comm);
  if (iVar7 < 2) {
    local_94 = 0x400;
    bVar2 = false;
    local_a0 = 0xffff;
    local_9c = 0x300;
    iVar9 = 1;
  }
  else {
    local_9c = 0x300;
    local_a0 = 0xffff;
    bVar2 = false;
    local_94 = 0x400;
    iVar9 = 1;
    do {
      pcVar11 = ppcVar1[iVar9];
      iVar5 = strcmp(pcVar11,"-width");
      if (iVar5 == 0) {
        iVar5 = iVar9 + 1;
        local_94 = atoi(ppcVar1[(long)iVar9 + 1]);
      }
      else {
        iVar5 = strcmp(pcVar11,"-height");
        if (iVar5 == 0) {
          iVar5 = iVar9 + 1;
          local_9c = atoi(ppcVar1[(long)iVar9 + 1]);
        }
        else {
          iVar6 = strcmp(pcVar11,"-nologdebug");
          iVar5 = iVar9;
          if (iVar6 == 0) {
            local_a0 = local_a0 & 0x103;
          }
          else {
            iVar6 = strcmp(pcVar11,"-redirect");
            if (iVar6 != 0) {
              if (*pcVar11 == '-') {
                if (((pcVar11[1] != 'h') || (pcVar11[2] != '\0')) &&
                   (iVar5 = strcmp(pcVar11,"-help"), iVar5 != 0)) {
                  if ((pcVar11[1] != 'R') || (pcVar11[2] != '\0')) {
                    if ((pcVar11[1] != '-') || (pcVar11[2] != '\0')) {
                      __format = "Unknown options `%s\'.  Try -h for help.\n";
                      goto LAB_00109637;
                    }
                    iVar9 = iVar9 + 1;
                  }
                  break;
                }
              }
              else {
                iVar5 = strcmp(pcVar11,"-help");
                if (iVar5 != 0) break;
              }
              usage((char **)*ppcVar1);
              exit(0);
            }
            bVar2 = true;
          }
        }
      }
      iVar9 = iVar5 + 1;
    } while (iVar9 < iVar7);
  }
  uVar10 = 1;
  if (iVar9 < iVar7) {
    uVar10 = (iVar7 - iVar9) + 1;
    lVar8 = 0;
    do {
      ppcVar1[lVar8 + 1] = ppcVar1[iVar9 + lVar8];
      lVar8 = lVar8 + 1;
    } while ((ulong)uVar10 - 1 != lVar8);
  }
  *argcp = uVar10;
  if ((iVar4 < 2) || (1 < uVar10)) {
    if ((!bVar2) || (1 < uVar10)) {
      SCREEN_WIDTH = local_94;
      SCREEN_HEIGHT = local_9c;
      context = icetCreateContext(comm);
      icetDiagnostics(local_a0);
      if (!bVar2) {
        realstdout = _stdout;
        strategy_list[0] = 0x6001;
        strategy_list[1] = 0x6002;
        strategy_list[2] = 0x6003;
        strategy_list[3] = 0x6004;
        strategy_list[4] = 0x6005;
        single_image_strategy_list[0] = 0x7001;
        single_image_strategy_list[1] = 0x7002;
        single_image_strategy_list[2] = 0x7004;
        single_image_strategy_list[3] = 0x7003;
        return;
      }
      if (uVar3 == 0) {
        iVar7 = dup(1);
        realstdout = (FILE *)fdopen(iVar7,"wt");
      }
      sprintf(local_78,"log.%04d",(ulong)uVar3);
      iVar7 = open(local_78,0x441,0x1a4);
      if (-1 < iVar7) {
        dup2(iVar7,1);
        strategy_list[0] = 0x6001;
        strategy_list[1] = 0x6002;
        strategy_list[2] = 0x6003;
        strategy_list[3] = 0x6004;
        strategy_list[4] = 0x6005;
        single_image_strategy_list[0] = 0x7001;
        single_image_strategy_list[1] = 0x7002;
        single_image_strategy_list[2] = 0x7004;
        single_image_strategy_list[3] = 0x7003;
        return;
      }
      __format = "Could not open %s for writing.\n";
      pcVar11 = local_78;
LAB_00109637:
      printf(__format,pcVar11);
      goto LAB_0010963e;
    }
    pcVar11 = "You must select a test on the command line when redirecting the output.";
  }
  else {
    pcVar11 = "You must select a test on the command line when using more than one process.";
  }
  puts(pcVar11);
  puts("Try -h for help.");
LAB_0010963e:
  exit(1);
}

Assistant:

void initialize_test(int *argcp, char ***argvp, IceTCommunicator comm)
{
    int arg;
    int argc = *argcp;
    char **argv = *argvp;
    int width = 1024;
    int height = 768;
    IceTBitField diag_level = ICET_DIAG_FULL;
    int redirect = 0;
    int rank, num_proc;

    rank = (*comm->Comm_rank)(comm);
    num_proc = (*comm->Comm_size)(comm);

  /* This is convenient code to attach a debugger to a particular process at the
     start of a test. */
    /* if (rank == 0) { */
    /*     int i = 0; */
    /*     printf("Waiting in process %d\n", getpid()); */
    /*     while (i == 0) sleep(1); */
    /* } */

#ifdef ICET_TESTS_USE_OPENGL
  /* Let Glut have first pass at the arguments to grab any that it can use. */
    glutInit(argcp, *argvp);
#endif

  /* Parse my arguments. */
    for (arg = 1; arg < argc; arg++) {
        if (strcmp(argv[arg], "-width") == 0) {
            width = atoi(argv[++arg]);
        } else if (strcmp(argv[arg], "-height") == 0) {
            height = atoi(argv[++arg]);
        } else if (strcmp(argv[arg], "-nologdebug") == 0) {
            diag_level &= ICET_DIAG_WARNINGS | ICET_DIAG_ALL_NODES;
        } else if (strcmp(argv[arg], "-redirect") == 0) {
            redirect = 1;
        } else if (   (strcmp(argv[arg], "-h") == 0)
                   || (strcmp(argv[arg], "-help") == 0) ) {
            usage(argv);
            exit(0);
        } else if (   (strcmp(argv[arg], "-R") == 0)
                   || (strncmp(argv[arg], "-", 1) != 0) ) {
            break;
        } else if (strcmp(argv[arg], "--") == 0) {
            arg++;
            break;
        } else {
            printf("Unknown options `%s'.  Try -h for help.\n", argv[arg]);
            exit(1);
        }
    }

  /* Fix arguments for next bout of parsing. */
    *argcp = 1;
    for ( ; arg < argc; arg++, (*argcp)++) {
        argv[*argcp] = argv[arg];
    }
    argc = *argcp;

  /* Make sure selected options are consistent. */
    if ((num_proc > 1) && (argc < 2)) {
        printf("You must select a test on the command line when using more than one process.\n");
        printf("Try -h for help.\n");
        exit(1);
    }
    if (redirect && (argc < 2)) {
        printf("You must select a test on the command line when redirecting the output.\n");
        printf("Try -h for help.\n");
        exit(1);
    }

#ifdef ICET_TESTS_USE_OPENGL
  /* Create a renderable window. */
    glutInitDisplayMode(GLUT_RGBA | GLUT_DOUBLE | GLUT_DEPTH | GLUT_ALPHA);
    glutInitWindowPosition(0, 0);
    glutInitWindowSize(width, height);

    {
        char title[256];
        sprintf(title, "IceT Test %d of %d", rank, num_proc);
        windowId = glutCreateWindow(title);
    }
#endif /* ICET_TESTS_USE_OPENGL */

    SCREEN_WIDTH = width;
    SCREEN_HEIGHT = height;

  /* Create an IceT context. */
    context = icetCreateContext(comm);
    icetDiagnostics(diag_level);
#ifdef ICET_TESTS_USE_OPENGL
    icetGLInitialize();
#endif

  /* Redirect standard output on demand. */
    if (redirect) {
        char filename[64];
        int outfd;
        if (rank == 0) {
            realstdout = fdopen(dup(1), "wt");
        } else {
            realstdout = NULL;
        }
        sprintf(filename, "log.%04d", rank);
        outfd = open(filename, O_WRONLY | O_CREAT | O_APPEND, 0644);
        if (outfd < 0) {
            printf("Could not open %s for writing.\n", filename);
            exit(1);
        }
        dup2(outfd, 1);
    } else {
        realstdout = stdout;
    }

    strategy_list[0] = ICET_STRATEGY_DIRECT;
    strategy_list[1] = ICET_STRATEGY_SEQUENTIAL;
    strategy_list[2] = ICET_STRATEGY_SPLIT;
    strategy_list[3] = ICET_STRATEGY_REDUCE;
    strategy_list[4] = ICET_STRATEGY_VTREE;

    single_image_strategy_list[0] = ICET_SINGLE_IMAGE_STRATEGY_AUTOMATIC;
    single_image_strategy_list[1] = ICET_SINGLE_IMAGE_STRATEGY_BSWAP;
    single_image_strategy_list[2] = ICET_SINGLE_IMAGE_STRATEGY_RADIXK;
    single_image_strategy_list[3] = ICET_SINGLE_IMAGE_STRATEGY_TREE;
}